

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

void __thiscall spvtools::opt::IRContext::BuildValueNumberTable(IRContext *this)

{
  byte *pbVar1;
  pointer __p;
  IRContext *local_20;
  pointer local_18;
  
  local_20 = this;
  MakeUnique<spvtools::opt::ValueNumberTable,spvtools::opt::IRContext*>
            ((spvtools *)&local_18,&local_20);
  __p = local_18;
  local_18 = (pointer)0x0;
  std::
  __uniq_ptr_impl<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
  ::reset((__uniq_ptr_impl<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
           *)&this->vn_table_,__p);
  std::
  unique_ptr<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
  ::~unique_ptr((unique_ptr<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
                 *)&local_18);
  pbVar1 = (byte *)((long)&this->valid_analyses_ + 1);
  *pbVar1 = *pbVar1 | 4;
  return;
}

Assistant:

void BuildValueNumberTable() {
    vn_table_ = MakeUnique<ValueNumberTable>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisValueNumberTable;
  }